

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr.c
# Opt level: O3

void ustr_resize(UString_conflict *s,int32_t len,UErrorCode *status)

{
  UChar *pUVar1;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  pUVar1 = (UChar *)uprv_realloc_63(s->fChars,(long)len * 2 + 2);
  s->fChars = pUVar1;
  if (pUVar1 == (UChar *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    s->fLength = 0;
    s->fCapacity = 0;
  }
  else {
    s->fCapacity = len;
  }
  return;
}

Assistant:

static void
ustr_resize(struct UString *s,
        int32_t len,
        UErrorCode *status)
{
    if(U_FAILURE(*status))
        return;

    /* +1 for trailing 0x0000 */
    s->fChars = (UChar*) uprv_realloc(s->fChars, sizeof(UChar) * (len + 1));
    if(s->fChars == 0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        s->fLength = s->fCapacity = 0;
        return;
    }

    s->fCapacity = len;
}